

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImGui::CalcTypematicPressedRepeatAmount
              (float t,float t_prev,float repeat_delay,float repeat_rate)

{
  int iVar1;
  int iVar2;
  float in_XMM0_Db;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float in_XMM1_Db;
  
  iVar1 = 1;
  if ((((t != 0.0) || (NAN(t))) && (iVar1 = 0, repeat_delay < t)) && (0.0 < repeat_rate)) {
    auVar3._0_4_ = t - repeat_delay;
    auVar3._4_4_ = t_prev - repeat_delay;
    auVar3._8_4_ = in_XMM0_Db - repeat_delay;
    auVar3._12_4_ = in_XMM1_Db - repeat_delay;
    auVar4._4_4_ = repeat_rate;
    auVar4._0_4_ = repeat_rate;
    auVar4._8_4_ = repeat_rate;
    auVar4._12_4_ = repeat_rate;
    auVar4 = divps(auVar3,auVar4);
    iVar2 = (int)auVar4._0_4_ - (int)auVar4._4_4_;
    iVar1 = 0;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    return iVar1;
  }
  return iVar1;
}

Assistant:

int ImGui::CalcTypematicPressedRepeatAmount(float t, float t_prev, float repeat_delay, float repeat_rate)
{
    if (t == 0.0f)
        return 1;
    if (t <= repeat_delay || repeat_rate <= 0.0f)
        return 0;
    const int count = (int)((t - repeat_delay) / repeat_rate) - (int)((t_prev - repeat_delay) / repeat_rate);
    return (count > 0) ? count : 0;
}